

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O2

bool __thiscall
CppUnit::TestPath::splitPathString(TestPath *this,string *pathAsString,PathTestNames *testNames)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  undefined1 local_31;
  
  if (pathAsString->_M_string_length == 0) {
    local_31 = 1;
  }
  else {
    local_31 = *(pathAsString->_M_dataplus)._M_p != '/';
    while( true ) {
      iVar1 = std::__cxx11::string::find((char)pathAsString,0x2f);
      if (iVar1 < 0) break;
      std::__cxx11::string::substr((ulong)&local_58,(ulong)pathAsString);
      std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)testNames,
                 &local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    std::__cxx11::string::substr((ulong)&local_58,(ulong)pathAsString);
    std::deque<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((deque<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)testNames,
               &local_58);
    std::__cxx11::string::~string((string *)&local_58);
  }
  return (bool)local_31;
}

Assistant:

bool
TestPath::splitPathString( const std::string &pathAsString,
                           PathTestNames &testNames )
{
  if ( pathAsString.empty() )
    return true;

  bool isRelative = pathAsString[0] != '/';

  int index = (isRelative ? 0 : 1);
  while ( true )
  {
    int separatorIndex = pathAsString.find( '/', index );
    if ( separatorIndex >= 0 )
    {
      testNames.push_back( pathAsString.substr( index, separatorIndex - index ) );
      index = separatorIndex + 1;
    }
    else
    {
      testNames.push_back( pathAsString.substr( index ) );
      break;
    }
  }

  return isRelative;
}